

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O0

SUNErrCode SUNProfiler_Free(SUNProfiler *p)

{
  long *in_RDI;
  SUNHashMap *in_stack_ffffffffffffffe8;
  
  if ((in_RDI != (long *)0x0) && (*in_RDI != 0)) {
    if (*in_RDI != 0) {
      SUNHashMap_Destroy(in_stack_ffffffffffffffe8);
      sunTimerStructFree(in_RDI);
      free(*(void **)(*in_RDI + 8));
      free((void *)*in_RDI);
    }
    *in_RDI = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNProfiler_Free(SUNProfiler* p)
{
  if (!p || !(*p)) { return SUN_SUCCESS; }

  SUNDIALS_MARK_END(*p, SUNDIALS_ROOT_TIMER);

  if (*p)
  {
    SUNHashMap_Destroy(&(*p)->map);
    sunTimerStructFree((void*)(*p)->overhead);
#if SUNDIALS_MPI_ENABLED
    if ((*p)->comm != SUN_COMM_NULL) { MPI_Comm_free(&(*p)->comm); }
#endif
    free((*p)->title);
    free(*p);
  }
  *p = NULL;

  return SUN_SUCCESS;
}